

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *type_names,Index binding_index_offset)

{
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  string name;
  Location loc;
  Var type;
  string local_110;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_f0;
  ulong local_e8;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *local_e0;
  undefined1 local_d8 [32];
  TokenType local_b8;
  Type local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Var local_78;
  
  local_e8 = (ulong)binding_index_offset;
  local_f0 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)type_names;
  local_e0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)bindings;
  do {
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      return (Result)Ok;
    }
    TVar2 = Peek(this,0);
    if (TVar2 == Last_String) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      Var::Var(&local_78);
      GetToken((Token *)local_d8,this);
      uStack_90 = CONCAT44(local_d8._12_4_,local_d8._8_4_);
      local_88 = CONCAT44(local_d8._20_4_,local_d8._16_4_);
      uStack_80 = CONCAT44(local_d8._28_4_,local_d8._24_4_);
      local_98.enum_ = local_d8._0_4_;
      local_98.type_index_ = local_d8._4_4_;
      ParseBindVarOpt(this,&local_110);
      RVar3 = ParseValueType(this,&local_78);
      if (RVar3.enum_ != Error) {
        local_b8 = (int)((ulong)((long)(types->
                                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(types->
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) +
                   binding_index_offset;
        local_d8._16_4_ = (int)local_88;
        local_d8._20_4_ = local_88._4_4_;
        local_d8._24_4_ = (int)uStack_80;
        local_d8._28_4_ = uStack_80._4_4_;
        local_d8._0_8_ = local_98;
        local_d8._8_4_ = (undefined4)uStack_90;
        local_d8._12_4_ = uStack_90._4_4_;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
        ::_M_emplace<std::__cxx11::string&,wabt::Binding>(local_e0,0,&local_110,local_d8);
        if (local_78.type_ == Name) {
          if ((this->options_->features).function_references_enabled_ == false) {
            __assert_fail("options_->features.function_references_enabled()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                          ,0x749,
                          "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, std::unordered_map<uint32_t, std::string> *, Index)"
                         );
          }
          local_d8._0_8_ =
               ((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) + local_e8;
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_long,std::__cxx11::string_const&>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)type_names,local_d8,&local_78.field_2);
          local_d8._0_4_ = Reference;
          local_d8._4_4_ = 0xffffffff;
          type_names = (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_f0;
        }
        else {
          if (local_78.type_ != Index) {
            __assert_fail("type.is_name()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                          ,0x748,
                          "Result wabt::WastParser::ParseBoundValueTypeList(TokenType, TypeVector *, BindingHash *, std::unordered_map<uint32_t, std::string> *, Index)"
                         );
          }
          local_d8._4_4_ = 0xffffffff;
          local_d8._0_4_ = local_78.field_2.index_;
        }
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                  (types,(Type *)local_d8);
      }
      Var::~Var(&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      RVar3 = ParseValueTypeList(this,types,type_names);
    }
  } while ((RVar3.enum_ != Error) && (RVar3 = Expect(this,Rpar), RVar3.enum_ != Error));
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBoundValueTypeList(
    TokenType token,
    TypeVector* types,
    BindingHash* bindings,
    std::unordered_map<uint32_t, std::string>* type_names,
    Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Var type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      if (type.is_index()) {
        types->push_back(Type(type.index()));
      } else {
        assert(type.is_name());
        assert(options_->features.function_references_enabled());
        type_names->emplace(binding_index_offset + types->size(), type.name());
        types->push_back(Type(Type::Reference, kInvalidIndex));
      }
    } else {
      CHECK_RESULT(ParseValueTypeList(types, type_names));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}